

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_1::filterRequiresFilterability(deUint32 filter)

{
  if ((2 < filter - 0x2701) && (filter != 0x2601)) {
    return false;
  }
  return true;
}

Assistant:

bool filterRequiresFilterability (deUint32 filter)
{
	switch (filter)
	{
		case GL_NEAREST:
		case GL_NEAREST_MIPMAP_NEAREST:
			return false;

		case GL_LINEAR:
		case GL_LINEAR_MIPMAP_NEAREST:
		case GL_NEAREST_MIPMAP_LINEAR:
		case GL_LINEAR_MIPMAP_LINEAR:
			return true;

		default:
			DE_ASSERT(false);
			return false;
	}
}